

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int stbi_hdr_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  
  lVar2 = ftell((FILE *)f);
  cVar3 = '#';
  lVar4 = 1;
  while( true ) {
    iVar1 = 0;
    if (f != (FILE *)0x0) {
      iVar1 = fgetc((FILE *)f);
      if (iVar1 == -1) {
        iVar1 = 0;
      }
    }
    if (iVar1 != cVar3) break;
    cVar3 = "#?RADIANCE\n"[lVar4];
    lVar4 = lVar4 + 1;
    if (lVar4 == 0xc) {
      iVar1 = 1;
LAB_001548cc:
      fseek((FILE *)f,(long)(int)lVar2,0);
      return iVar1;
    }
  }
  iVar1 = 0;
  goto LAB_001548cc;
}

Assistant:

int stbi_hdr_test_file(FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s, f);
   r = hdr_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}